

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

void __thiscall
vkt::synchronization::anon_unknown_0::VertexInput::Implementation::~Implementation
          (Implementation *this)

{
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__Implementation_00c0aee0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            (&(this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  de::details::
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::
  ~UniqueBase(&(this->m_colorAttachmentImage).
               super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
             );
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
  ~UniqueBase(&(this->m_indirectBuffer).
               super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             );
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
  ~UniqueBase(&(this->m_indexBuffer).
               super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             );
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
  ~UniqueBase(&(this->m_outputBuffer).
               super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             );
  return;
}

Assistant:

Implementation (OperationContext& context, Resource& resource)
		: m_context		(context)
		, m_resource	(resource)
	{
		requireFeaturesForSSBOAccess (m_context, VK_SHADER_STAGE_VERTEX_BIT);

		const DeviceInterface&		vk				= context.getDeviceInterface();
		const VkDevice				device			= context.getDevice();
		Allocator&					allocator		= context.getAllocator();
		const VkDeviceSize			dataSizeBytes	= m_resource.getBuffer().size;

		m_outputBuffer = de::MovePtr<Buffer>(new Buffer(vk, device, allocator,
			makeBufferCreateInfo(dataSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible));

		{
			const Allocation& alloc = m_outputBuffer->getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(dataSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), dataSizeBytes);
		}

		m_descriptorSetLayout = DescriptorSetLayoutBuilder()
			.addSingleBinding	(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_VERTEX_BIT)
			.build				(vk, device);

		m_descriptorPool = DescriptorPoolBuilder()
			.addType	(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
			.build		(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

		m_descriptorSet = makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

		const VkDescriptorBufferInfo outputBufferDescriptorInfo = makeDescriptorBufferInfo(m_outputBuffer->get(), 0ull, dataSizeBytes);
		DescriptorSetUpdateBuilder()
			.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &outputBufferDescriptorInfo)
			.update		(vk, device);

		// Color attachment
		m_colorFormat						= VK_FORMAT_R8G8B8A8_UNORM;
		m_colorImageSubresourceRange		= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
		m_colorImageExtent					= makeExtent3D(16u, 16u, 1u);
		m_colorAttachmentImage				= de::MovePtr<Image>(new Image(vk, device, allocator,
			makeImageCreateInfo(VK_IMAGE_TYPE_2D, m_colorImageExtent, m_colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT),
			MemoryRequirement::Any));

		// Pipeline
		m_colorAttachmentView	= makeImageView		(vk, device, **m_colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, m_colorFormat, m_colorImageSubresourceRange);
		m_renderPass			= makeRenderPass	(vk, device, m_colorFormat);
		m_framebuffer			= makeFramebuffer	(vk, device, *m_renderPass, *m_colorAttachmentView, m_colorImageExtent.width, m_colorImageExtent.height, 1u);
		m_pipelineLayout		= makePipelineLayout(vk, device, *m_descriptorSetLayout);

		m_pipeline = GraphicsPipelineBuilder()
			.setPrimitiveTopology			(VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
			.setRenderSize					(tcu::IVec2(static_cast<int>(m_colorImageExtent.width), static_cast<int>(m_colorImageExtent.height)))
			.setVertexInputSingleAttribute	(VK_FORMAT_R32G32B32A32_UINT, tcu::getPixelSize(mapVkFormat(VK_FORMAT_R32G32B32A32_UINT)))
			.setShader						(vk, device, VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("input_vert"), DE_NULL)
			.setShader						(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("input_frag"), DE_NULL)
			.build							(vk, device, *m_pipelineLayout, *m_renderPass, context.getPipelineCacheData());
	}